

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execute_conjunction.cpp
# Opt level: O0

idx_t __thiscall
duckdb::ExpressionExecutor::Select
          (ExpressionExecutor *this,BoundConjunctionExpression *expr,ExpressionState *state_p,
          SelectionVector *sel,idx_t count,SelectionVector *true_sel,SelectionVector *false_sel)

{
  sel_t **ppsVar1;
  ExpressionType EVar2;
  size_type sVar3;
  SelectionVector *pSVar4;
  pointer this_00;
  pointer expr_00;
  idx_t iVar5;
  ExpressionExecutor *in_RCX;
  BaseExpression *in_RSI;
  SelectionVector *in_R8;
  AdaptiveFilter *in_R9;
  ExpressionExecutor *in_stack_00000008;
  idx_t i_3;
  idx_t tcount_1;
  idx_t i_2;
  unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true>
  temp_false_1;
  unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true>
  temp_true_1;
  idx_t result_count;
  idx_t current_count_1;
  SelectionVector *current_sel_1;
  AdaptiveFilterState filter_state_1;
  idx_t i_1;
  idx_t fcount;
  idx_t tcount;
  idx_t i;
  unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true> temp_false
  ;
  unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true> temp_true;
  idx_t false_count;
  idx_t current_count;
  SelectionVector *current_sel;
  AdaptiveFilterState filter_state;
  ConjunctionState *state;
  ExpressionExecutor *in_stack_fffffffffffffd78;
  ExpressionState *in_stack_fffffffffffffd80;
  AdaptiveFilter *in_stack_fffffffffffffd88;
  SelectionVector *in_stack_fffffffffffffd90;
  AdaptiveFilter *in_stack_fffffffffffffd98;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  in_stack_fffffffffffffda0;
  ExpressionState *in_stack_fffffffffffffda8;
  Expression *in_stack_fffffffffffffdb0;
  ExpressionExecutor *in_stack_fffffffffffffdb8;
  ExpressionExecutor *this_01;
  SelectionVector *in_stack_fffffffffffffdd0;
  ulong local_130;
  ulong local_120;
  SelectionVector *local_e8;
  ExpressionExecutor *local_d8;
  ulong local_c0;
  ulong local_a8;
  SelectionVector *local_58;
  SelectionVector *local_8;
  
  ExpressionState::Cast<duckdb::ConjunctionState>(in_stack_fffffffffffffd80);
  EVar2 = BaseExpression::GetExpressionType(in_RSI);
  if (EVar2 == CONJUNCTION_AND) {
    unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true>::
    operator->((unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true>
                *)in_stack_fffffffffffffd80);
    AdaptiveFilter::BeginFilter(in_stack_fffffffffffffd88);
    unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true>::
    unique_ptr((unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true>
                *)0x632886);
    unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true>::
    unique_ptr((unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true>
                *)0x632893);
    if (in_stack_00000008 != (ExpressionExecutor *)0x0) {
      make_uniq<duckdb::SelectionVector,unsigned_int>((uint *)in_stack_fffffffffffffd98);
      unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true>::
      operator=((unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true>
                 *)in_stack_fffffffffffffd80,
                (unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true>
                 *)in_stack_fffffffffffffd78);
      unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true>::
      ~unique_ptr((unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true>
                   *)0x6328e2);
    }
    if (in_R9 == (AdaptiveFilter *)0x0) {
      make_uniq<duckdb::SelectionVector,unsigned_int>((uint *)in_stack_fffffffffffffd98);
      unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true>::
      operator=((unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true>
                 *)in_stack_fffffffffffffd80,
                (unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true>
                 *)in_stack_fffffffffffffd78);
      unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true>::
      ~unique_ptr((unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true>
                   *)0x632966);
      ::std::unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>_>::get
                ((unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>_>
                  *)in_stack_fffffffffffffd80);
    }
    local_58 = in_R8;
    for (local_a8 = 0;
        sVar3 = ::std::
                vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ::size((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        *)in_RSI[1].alias.field_2._M_local_buf), local_a8 < sVar3;
        local_a8 = local_a8 + 1) {
      unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true>::
      operator->((unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true>
                  *)in_stack_fffffffffffffd80);
      vector<unsigned_long,_true>::operator[]
                ((vector<unsigned_long,_true> *)in_stack_fffffffffffffd80,
                 (size_type)in_stack_fffffffffffffd78);
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
      ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    *)in_stack_fffffffffffffd80,(size_type)in_stack_fffffffffffffd78);
      unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 in_stack_fffffffffffffd80);
      unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true>::
      operator->((unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true>
                  *)in_stack_fffffffffffffd80);
      vector<unsigned_long,_true>::operator[]
                ((vector<unsigned_long,_true> *)in_stack_fffffffffffffd80,
                 (size_type)in_stack_fffffffffffffd78);
      vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
      ::operator[]((vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
                    *)in_stack_fffffffffffffd80,(size_type)in_stack_fffffffffffffd78);
      ::std::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>::get
                ((unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
                  *)in_stack_fffffffffffffd80);
      in_stack_fffffffffffffd78 =
           (ExpressionExecutor *)
           ::std::unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>_>
           ::get((unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>_>
                  *)in_stack_fffffffffffffd80);
      pSVar4 = (SelectionVector *)
               Select(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                      (SelectionVector *)in_stack_fffffffffffffda0.__d.__r,
                      (idx_t)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
                      in_stack_fffffffffffffdd0);
      if ((local_58 != pSVar4) && (in_stack_00000008 != (ExpressionExecutor *)0x0)) {
        for (local_c0 = 0; local_c0 < (ulong)((long)local_58 - (long)pSVar4);
            local_c0 = local_c0 + 1) {
          this_00 = unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true>
                    ::operator->((unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true>
                                  *)in_stack_fffffffffffffd80);
          SelectionVector::get_index(this_00,local_c0);
          SelectionVector::set_index
                    (in_stack_fffffffffffffd90,(idx_t)in_stack_fffffffffffffd88,
                     (idx_t)in_stack_fffffffffffffd80);
        }
      }
      local_58 = pSVar4;
      if (pSVar4 == (SelectionVector *)0x0) break;
    }
    unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true>::
    operator->((unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true>
                *)in_stack_fffffffffffffd80);
    AdaptiveFilter::EndFilter
              (in_stack_fffffffffffffd98,(AdaptiveFilterState)in_stack_fffffffffffffda0.__d.__r);
    local_8 = local_58;
    unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true>::
    ~unique_ptr((unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true>
                 *)0x632d0f);
    unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true>::
    ~unique_ptr((unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true>
                 *)0x632d1c);
  }
  else {
    unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true>::
    operator->((unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true>
                *)in_stack_fffffffffffffd80);
    AdaptiveFilter::BeginFilter(in_stack_fffffffffffffd88);
    local_e8 = (SelectionVector *)0x0;
    unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true>::
    unique_ptr((unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true>
                *)0x632d7e);
    unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true>::
    unique_ptr((unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true>
                *)0x632d8b);
    if (in_R9 != (AdaptiveFilter *)0x0) {
      make_uniq<duckdb::SelectionVector,unsigned_int>((uint *)in_stack_fffffffffffffd98);
      unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true>::
      operator=((unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true>
                 *)in_stack_fffffffffffffd80,
                (unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true>
                 *)in_stack_fffffffffffffd78);
      unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true>::
      ~unique_ptr((unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true>
                   *)0x632dda);
    }
    if (in_stack_00000008 == (ExpressionExecutor *)0x0) {
      make_uniq<duckdb::SelectionVector,unsigned_int>((uint *)in_stack_fffffffffffffd98);
      unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true>::
      operator=((unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true>
                 *)in_stack_fffffffffffffd80,
                (unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true>
                 *)in_stack_fffffffffffffd78);
      unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true>::
      ~unique_ptr((unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true>
                   *)0x632e5e);
      in_stack_00000008 =
           (ExpressionExecutor *)
           ::std::unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>_>
           ::get((unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>_>
                  *)in_stack_fffffffffffffd80);
    }
    local_d8 = in_RCX;
    for (local_120 = 0;
        sVar3 = ::std::
                vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ::size((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        *)in_RSI[1].alias.field_2._M_local_buf), local_120 < sVar3;
        local_120 = local_120 + 1) {
      unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true>::
      operator->((unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true>
                  *)in_stack_fffffffffffffd80);
      vector<unsigned_long,_true>::operator[]
                ((vector<unsigned_long,_true> *)in_stack_fffffffffffffd80,
                 (size_type)in_stack_fffffffffffffd78);
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
      ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    *)in_stack_fffffffffffffd80,(size_type)in_stack_fffffffffffffd78);
      unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 in_stack_fffffffffffffd80);
      unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true>::
      operator->((unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true>
                  *)in_stack_fffffffffffffd80);
      vector<unsigned_long,_true>::operator[]
                ((vector<unsigned_long,_true> *)in_stack_fffffffffffffd80,
                 (size_type)in_stack_fffffffffffffd78);
      pSVar4 = (SelectionVector *)
               vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
               ::operator[]((vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
                             *)in_stack_fffffffffffffd80,(size_type)in_stack_fffffffffffffd78);
      expr_00 = ::std::
                unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>::
                get((unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
                     *)in_stack_fffffffffffffd80);
      this_01 = local_d8;
      ::std::unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>_>::get
                ((unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>_>
                  *)in_stack_fffffffffffffd80);
      in_stack_fffffffffffffd78 = in_stack_00000008;
      iVar5 = Select(this_01,(Expression *)expr_00,in_stack_fffffffffffffda8,
                     (SelectionVector *)in_stack_fffffffffffffda0.__d.__r,
                     (idx_t)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,pSVar4);
      if (iVar5 != 0) {
        if (in_R9 != (AdaptiveFilter *)0x0) {
          for (local_130 = 0; local_130 < iVar5; local_130 = local_130 + 1) {
            ppsVar1 = &local_e8->sel_vector;
            in_stack_fffffffffffffd98 = in_R9;
            in_stack_fffffffffffffda8 =
                 (ExpressionState *)
                 unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true>
                 ::operator->((unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true>
                               *)in_stack_fffffffffffffd80);
            in_stack_fffffffffffffd90 =
                 (SelectionVector *)
                 SelectionVector::get_index((SelectionVector *)in_stack_fffffffffffffda8,local_130);
            SelectionVector::set_index
                      (in_stack_fffffffffffffd90,(idx_t)in_stack_fffffffffffffd88,
                       (idx_t)in_stack_fffffffffffffd80);
            in_stack_fffffffffffffda0.__d.__r = (duration)(duration)local_e8;
            local_e8 = (SelectionVector *)((long)ppsVar1 + 1);
          }
        }
        local_d8 = in_stack_00000008;
      }
    }
    if (in_R9 != (AdaptiveFilter *)0x0) {
      SelectionVector::Sort
                ((SelectionVector *)in_stack_fffffffffffffd80,(idx_t)in_stack_fffffffffffffd78);
    }
    unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true>::
    operator->((unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true>
                *)in_stack_fffffffffffffd80);
    AdaptiveFilter::EndFilter
              (in_stack_fffffffffffffd98,(AdaptiveFilterState)in_stack_fffffffffffffda0.__d.__r);
    local_8 = local_e8;
    unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true>::
    ~unique_ptr((unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true>
                 *)0x63319b);
    unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true>::
    ~unique_ptr((unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true>
                 *)0x6331a8);
  }
  return (idx_t)local_8;
}

Assistant:

idx_t ExpressionExecutor::Select(const BoundConjunctionExpression &expr, ExpressionState *state_p,
                                 const SelectionVector *sel, idx_t count, SelectionVector *true_sel,
                                 SelectionVector *false_sel) {
	auto &state = state_p->Cast<ConjunctionState>();

	if (expr.GetExpressionType() == ExpressionType::CONJUNCTION_AND) {
		// get runtime statistics
		auto filter_state = state.adaptive_filter->BeginFilter();
		const SelectionVector *current_sel = sel;
		idx_t current_count = count;
		idx_t false_count = 0;

		unique_ptr<SelectionVector> temp_true, temp_false;
		if (false_sel) {
			temp_false = make_uniq<SelectionVector>(STANDARD_VECTOR_SIZE);
		}
		if (!true_sel) {
			temp_true = make_uniq<SelectionVector>(STANDARD_VECTOR_SIZE);
			true_sel = temp_true.get();
		}
		for (idx_t i = 0; i < expr.children.size(); i++) {
			idx_t tcount = Select(*expr.children[state.adaptive_filter->permutation[i]],
			                      state.child_states[state.adaptive_filter->permutation[i]].get(), current_sel,
			                      current_count, true_sel, temp_false.get());
			idx_t fcount = current_count - tcount;
			if (fcount > 0 && false_sel) {
				// move failing tuples into the false_sel
				// tuples passed, move them into the actual result vector
				for (idx_t i = 0; i < fcount; i++) {
					false_sel->set_index(false_count++, temp_false->get_index(i));
				}
			}
			current_count = tcount;
			if (current_count == 0) {
				break;
			}
			if (current_count < count) {
				// tuples were filtered out: move on to using the true_sel to only evaluate passing tuples in subsequent
				// iterations
				current_sel = true_sel;
			}
		}
		// adapt runtime statistics
		state.adaptive_filter->EndFilter(filter_state);
		return current_count;
	} else {
		// get runtime statistics
		auto filter_state = state.adaptive_filter->BeginFilter();

		const SelectionVector *current_sel = sel;
		idx_t current_count = count;
		idx_t result_count = 0;

		unique_ptr<SelectionVector> temp_true, temp_false;
		if (true_sel) {
			temp_true = make_uniq<SelectionVector>(STANDARD_VECTOR_SIZE);
		}
		if (!false_sel) {
			temp_false = make_uniq<SelectionVector>(STANDARD_VECTOR_SIZE);
			false_sel = temp_false.get();
		}
		for (idx_t i = 0; i < expr.children.size(); i++) {
			idx_t tcount = Select(*expr.children[state.adaptive_filter->permutation[i]],
			                      state.child_states[state.adaptive_filter->permutation[i]].get(), current_sel,
			                      current_count, temp_true.get(), false_sel);
			if (tcount > 0) {
				if (true_sel) {
					// tuples passed, move them into the actual result vector
					for (idx_t i = 0; i < tcount; i++) {
						true_sel->set_index(result_count++, temp_true->get_index(i));
					}
				}
				// now move on to check only the non-passing tuples
				current_count -= tcount;
				current_sel = false_sel;
			}
		}
		if (true_sel) {
			true_sel->Sort(result_count);
		}

		// adapt runtime statistics
		state.adaptive_filter->EndFilter(filter_state);
		return result_count;
	}
}